

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O3

uint32_t WriteBinaryLight(aiLight *l)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint32_t n;
  uint32_t t;
  undefined4 local_20;
  aiLightSourceType local_1c;
  
  local_20 = 0x1235;
  fwrite(&local_20,4,1,(FILE *)out);
  fwrite(&local_20,4,1,(FILE *)out);
  lVar2 = ftell((FILE *)out);
  uVar1 = (l->mName).length;
  fwrite(l,4,1,(FILE *)out);
  fwrite((l->mName).data,(ulong)uVar1,1,(FILE *)out);
  local_1c = l->mType;
  fwrite(&local_1c,4,1,(FILE *)out);
  if (l->mType == aiLightSource_DIRECTIONAL) {
    iVar3 = uVar1 + 8;
  }
  else {
    fwrite(&l->mAttenuationConstant,4,1,(FILE *)out);
    fwrite(&l->mAttenuationLinear,4,1,(FILE *)out);
    fwrite(&l->mAttenuationQuadratic,4,1,(FILE *)out);
    iVar3 = uVar1 + 0x14;
  }
  fwrite(&l->mColorDiffuse,4,1,(FILE *)out);
  fwrite(&(l->mColorDiffuse).g,4,1,(FILE *)out);
  fwrite(&(l->mColorDiffuse).b,4,1,(FILE *)out);
  fwrite(&l->mColorSpecular,4,1,(FILE *)out);
  fwrite(&(l->mColorSpecular).g,4,1,(FILE *)out);
  fwrite(&(l->mColorSpecular).b,4,1,(FILE *)out);
  fwrite(&l->mColorAmbient,4,1,(FILE *)out);
  fwrite(&(l->mColorAmbient).g,4,1,(FILE *)out);
  fwrite(&(l->mColorAmbient).b,4,1,(FILE *)out);
  if (l->mType == aiLightSource_SPOT) {
    fwrite(&l->mAngleInnerCone,4,1,(FILE *)out);
    fwrite(&l->mAngleOuterCone,4,1,(FILE *)out);
    n = iVar3 + 0x2c;
  }
  else {
    n = iVar3 + 0x24;
  }
  ChangeInteger((int)lVar2 - 4,n);
  return n;
}

Assistant:

uint32_t WriteBinaryLight(const aiLight* l)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AILIGHT);

	len += Write<aiString>(l->mName);
	len += Write<unsigned int>(l->mType);

	if (l->mType != aiLightSource_DIRECTIONAL) { 
		len += Write<float>(l->mAttenuationConstant);
		len += Write<float>(l->mAttenuationLinear);
		len += Write<float>(l->mAttenuationQuadratic);
	}

	len += Write<aiColor3D>(l->mColorDiffuse);
	len += Write<aiColor3D>(l->mColorSpecular);
	len += Write<aiColor3D>(l->mColorAmbient);

	if (l->mType == aiLightSource_SPOT) {
		len += Write<float>(l->mAngleInnerCone);
		len += Write<float>(l->mAngleOuterCone);
	}

	ChangeInteger(old,len);
	return len;
}